

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd1D.c
# Opt level: O2

void run_1D_fdtd(fdtd1D *fdtd,float_type end_time,_Bool verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uintmax_t uVar3;
  border_position1D i_1;
  long lVar4;
  uintmax_t i_2;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uintmax_t i;
  ulong uVar8;
  bool bVar9;
  double dVar10;
  float_type fVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double divide;
  undefined1 auVar20 [64];
  double local_78;
  time_measure tstart_chunk;
  time_measure tend_chunk;
  
  auVar14._0_8_ = (end_time - fdtd->time) / fdtd->dt;
  auVar14._8_8_ = 0;
  auVar14 = vroundsd_avx(auVar14,auVar14,10);
  dVar12 = auVar14._0_8_;
  if (10.0 <= dVar12) {
    auVar20 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      auVar15._0_8_ = dVar12 / auVar20._0_8_;
      auVar15._8_8_ = auVar14._8_8_;
      auVar20 = ZEXT864((ulong)(auVar20._0_8_ + 1.0));
      auVar15 = vroundsd_avx(auVar15,auVar15,10);
    } while (dVar12 / auVar15._0_8_ < 10.0);
  }
  else {
    auVar15 = ZEXT816(0x3ff0000000000000);
  }
  lVar4 = vcvttsd2usi_avx512f(auVar15);
  dVar10 = 100.0 / (dVar12 / auVar15._0_8_);
  clock_gettime(4,(timespec *)&tstart_chunk);
  dVar12 = fdtd->time;
  lVar7 = 0;
  local_78 = dVar10;
  while (dVar12 < end_time) {
    dVar12 = fdtd->dt;
    uVar3 = fdtd->sizeX;
    lVar5 = 0;
    dVar13 = fdtd->dx;
    while( true ) {
      if (uVar3 - 1 == lVar5) break;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = fdtd->permeability_inv[lVar5];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = fdtd->hy[lVar5];
      auVar16._8_8_ = 0;
      auVar16._0_8_ = (dVar12 / dVar13) * (fdtd->ez[lVar5 + 1] - fdtd->ez[lVar5]);
      auVar14 = vfmadd213sd_fma(auVar18,auVar16,auVar1);
      fdtd->hy[lVar5] = auVar14._0_8_;
      lVar5 = lVar5 + 1;
    }
    lVar5 = 0;
    for (uVar8 = 0; uVar8 < fdtd->num_Msources; uVar8 = uVar8 + 1) {
      if (*(int *)((long)&fdtd->Msources->type + lVar5) == 0) {
        fVar11 = gaussian_pulse_val(fdtd->time,(fdtd_source *)((long)&fdtd->Msources->type + lVar5))
        ;
        fdtd->hy[fdtd->MsourceLocations[uVar8]] = fVar11 + fdtd->hy[fdtd->MsourceLocations[uVar8]];
      }
      lVar5 = lVar5 + 0x20;
    }
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      if (fdtd->border_condition[lVar5] == border_perfect_magnetic_conductor) {
        fdtd->hy[(fdtd->sizeX - 1) * lVar5] = 0.0;
      }
    }
    dVar12 = fdtd->dt;
    uVar8 = fdtd->sizeX;
    dVar13 = fdtd->dx;
    for (uVar6 = 1; uVar6 < uVar8; uVar6 = uVar6 + 1) {
      auVar19._8_8_ = 0;
      auVar19._0_8_ = fdtd->permittivity_inv[uVar6];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fdtd->ez[uVar6];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (dVar12 / dVar13) * (fdtd->hy[uVar6] - fdtd->hy[uVar6 - 1]);
      auVar14 = vfmadd213sd_fma(auVar19,auVar17,auVar2);
      fdtd->ez[uVar6] = auVar14._0_8_;
    }
    lVar5 = 0;
    for (uVar8 = 0; uVar8 < fdtd->num_Jsources; uVar8 = uVar8 + 1) {
      if (*(int *)((long)&fdtd->Jsources->type + lVar5) == 0) {
        fVar11 = gaussian_pulse_val(fdtd->time,(fdtd_source *)((long)&fdtd->Jsources->type + lVar5))
        ;
        fdtd->ez[fdtd->JsourceLocations[uVar8]] = fVar11 + fdtd->ez[fdtd->JsourceLocations[uVar8]];
      }
      lVar5 = lVar5 + 0x20;
    }
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      if (fdtd->border_condition[lVar5] == border_perfect_electric_conductor) {
        fdtd->ez[(fdtd->sizeX - 1) * lVar5] = 0.0;
      }
    }
    lVar5 = lVar7 + 1;
    bVar9 = lVar7 != lVar4 + -1;
    lVar7 = 0;
    if (bVar9) {
      lVar7 = lVar5;
    }
    if ((verbose) && (lVar7 == 0)) {
      clock_gettime(4,(timespec *)&tend_chunk);
      if (tend_chunk.tv_nsec < tstart_chunk.tv_nsec) {
        dVar12 = (double)((tend_chunk.tv_nsec - tstart_chunk.tv_nsec) + 1000000000) / 1000000000.0 +
                 -1.0;
      }
      else {
        dVar12 = (double)(tend_chunk.tv_nsec - tstart_chunk.tv_nsec) / 1000000000.0;
      }
      dVar13 = difftime(tend_chunk.tv_sec,tstart_chunk.tv_sec);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n",local_78,fdtd->time,fdtd->dt,
             end_time,dVar13 + dVar12,lVar4);
      local_78 = local_78 + dVar10;
      tstart_chunk.tv_sec = tend_chunk.tv_sec;
      tstart_chunk.tv_nsec = tend_chunk.tv_nsec;
    }
    dVar12 = fdtd->dt + fdtd->time;
    fdtd->time = dVar12;
  }
  return;
}

Assistant:

void run_1D_fdtd(struct fdtd1D *fdtd, float_type end_time, bool verbose) {
  const double num_iter_d = ceil((end_time - fdtd->time) / fdtd->dt);
  double print_interval_d;
  if (num_iter_d >= 10.) {
    double divide = 1.;
    do {
      print_interval_d = ceil(num_iter_d / divide);
      divide = divide + 1.;
    } while (num_iter_d / print_interval_d < 10.);
  } else {
    print_interval_d = 1.;
  }
  const size_t print_interval = (size_t)print_interval_d;
  const double percent_increment = 100. / (num_iter_d / print_interval_d);
  const size_t inter_print = print_interval - 1;
  size_t iter_count = 0;
  double percentage = percent_increment;
  time_measure tstart_chunk, tend_chunk;
  get_current_time(&tstart_chunk);
  for (; fdtd->time < end_time; fdtd->time += fdtd->dt) {
    update_magnetic_field(fdtd);
    apply_M_sources(fdtd);
    border_condition_magnetic(fdtd);

    update_electric_field(fdtd);
    apply_J_sources(fdtd);
    border_condition_electric(fdtd);

    iter_count = iter_count == inter_print ? 0 : iter_count + 1;
    if (verbose && iter_count == 0) {
      get_current_time(&tend_chunk);
      double difference = measuring_difftime(tstart_chunk, tend_chunk);
      printf("%.0f%% -- t=%e dt=%e tend=%e (%zu iter in %.3fs)\n", percentage,
             fdtd->time, fdtd->dt, end_time, print_interval, difference);
      percentage += percent_increment;
      tstart_chunk = tend_chunk;
    }
  }
}